

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_row_begin(nk_context *ctx,nk_layout_format fmt,float row_height,int cols)

{
  long lVar1;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  nk_panel *layout;
  nk_window *win;
  int in_stack_00000010;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) &&
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) != 0)) {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8);
    nk_panel_layout(ctx,(nk_window *)CONCAT44(fmt,row_height),(float)cols,in_stack_00000010);
    if (in_ESI == 0) {
      *(undefined4 *)(lVar1 + 0x70) = 1;
    }
    else {
      *(undefined4 *)(lVar1 + 0x70) = 5;
    }
    *(undefined8 *)(lVar1 + 0x88) = 0;
    *(undefined4 *)(lVar1 + 0x9c) = 0;
    *(undefined4 *)(lVar1 + 0x90) = 0;
    *(undefined4 *)(lVar1 + 0x98) = 0;
    *(undefined4 *)(lVar1 + 0x80) = in_EDX;
  }
  return;
}

Assistant:

NK_API void
nk_layout_row_begin(struct nk_context *ctx, enum nk_layout_format fmt,
float row_height, int cols)
{
struct nk_window *win;
struct nk_panel *layout;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
nk_panel_layout(ctx, win, row_height, cols);
if (fmt == NK_DYNAMIC)
layout->row.type = NK_LAYOUT_DYNAMIC_ROW;
else layout->row.type = NK_LAYOUT_STATIC_ROW;

layout->row.ratio = 0;
layout->row.filled = 0;
layout->row.item_width = 0;
layout->row.item_offset = 0;
layout->row.columns = cols;
}